

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O1

InterpolationRange *
tcu::anon_unknown_3::calcTriangleInterpolationWeights
          (InterpolationRange *__return_storage_ptr__,Vec4 *p0,Vec4 *p1,Vec4 *p2,Vec2 *ndpixel)

{
  InterpolationRange *returnValue;
  float fVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  float fVar6;
  deUint32 u32_6;
  undefined1 auVar7 [12];
  float fVar8;
  deUint32 u32;
  deUint32 u32_1;
  float fVar9;
  float fVar10;
  deUint32 u32_5;
  float fVar11;
  float fVar12;
  deUint32 u32_2;
  deUint32 u32_4;
  float fVar13;
  deUint32 u32_3;
  float fVar14;
  Vec2 nd2;
  Vec2 nd1;
  Vec2 nd0;
  undefined8 local_8;
  
  returnValue = __return_storage_ptr__;
  nd1.m_data = *(float (*) [2])p0->m_data;
  fVar14 = p0->m_data[3];
  nd0.m_data[0] = 0.0;
  nd0.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    nd0.m_data[lVar2] = nd1.m_data[lVar2] / fVar14;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  nd2.m_data = *(float (*) [2])p1->m_data;
  fVar13 = p1->m_data[3];
  nd1.m_data[0] = 0.0;
  nd1.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    nd1.m_data[lVar2] = nd2.m_data[lVar2] / fVar13;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  local_8 = *(undefined8 *)p2->m_data;
  fVar11 = p2->m_data[3];
  nd2.m_data[0] = 0.0;
  nd2.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    nd2.m_data[lVar2] = *(float *)((long)&local_8 + lVar2 * 4) / fVar11;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  fVar6 = ndpixel->m_data[0];
  fVar8 = ndpixel->m_data[1];
  fVar12 = ((nd1.m_data[0] - fVar6) * (nd2.m_data[1] - fVar8) -
           (nd2.m_data[0] - fVar6) * (nd1.m_data[1] - fVar8)) * 0.5;
  fVar10 = ((nd2.m_data[0] - fVar6) * (nd0.m_data[1] - fVar8) -
           (nd2.m_data[1] - fVar8) * (nd0.m_data[0] - fVar6)) * 0.5;
  fVar9 = fVar12;
  if (ABS(fVar12) != INFINITY) {
    fVar1 = (float)((uint)fVar12 & 0x7f800000);
    fVar9 = 1.1754944e-38;
    if (((uint)fVar12 & 0x7fffff) == 0) {
      fVar9 = fVar1;
    }
    if (fVar1 != 0.0) {
      fVar9 = fVar1;
    }
    fVar9 = ((float)((int)fVar9 + 0x6000) - fVar9) + fVar12;
  }
  fVar8 = ((nd0.m_data[0] - fVar6) * (nd1.m_data[1] - fVar8) -
          (nd0.m_data[1] - fVar8) * (nd1.m_data[0] - fVar6)) * 0.5;
  fVar6 = fVar10;
  if (ABS(fVar10) != INFINITY) {
    fVar1 = (float)((uint)fVar10 & 0x7f800000);
    fVar6 = 1.1754944e-38;
    if (((uint)fVar10 & 0x7fffff) == 0) {
      fVar6 = fVar1;
    }
    if (fVar1 != 0.0) {
      fVar6 = fVar1;
    }
    fVar6 = ((float)((int)fVar6 + 0x6000) - fVar6) + fVar10;
  }
  fVar1 = fVar8;
  if (ABS(fVar8) != INFINITY) {
    fVar4 = (float)((uint)fVar8 & 0x7f800000);
    fVar1 = 1.1754944e-38;
    if (((uint)fVar8 & 0x7fffff) == 0) {
      fVar1 = fVar4;
    }
    if (fVar4 != 0.0) {
      fVar1 = fVar4;
    }
    fVar1 = ((float)((int)fVar1 + 0x6000) - fVar1) + fVar8;
  }
  if (ABS(fVar12) != INFINITY) {
    fVar3 = (float)((uint)fVar12 & 0x7f800000);
    fVar4 = 1.1754944e-38;
    if (((uint)fVar12 & 0x7fffff) == 0) {
      fVar4 = fVar3;
    }
    if (fVar3 != 0.0) {
      fVar4 = fVar3;
    }
    fVar12 = fVar12 - ((float)((int)fVar4 + 0x6000) - fVar4);
  }
  if (ABS(fVar10) != INFINITY) {
    fVar3 = (float)((uint)fVar10 & 0x7f800000);
    fVar4 = 1.1754944e-38;
    if (((uint)fVar10 & 0x7fffff) == 0) {
      fVar4 = fVar3;
    }
    if (fVar3 != 0.0) {
      fVar4 = fVar3;
    }
    fVar10 = fVar10 - ((float)((int)fVar4 + 0x6000) - fVar4);
  }
  if (ABS(fVar8) != INFINITY) {
    fVar3 = (float)((uint)fVar8 & 0x7f800000);
    fVar4 = 1.1754944e-38;
    if (((uint)fVar8 & 0x7fffff) == 0) {
      fVar4 = fVar3;
    }
    if (fVar3 != 0.0) {
      fVar4 = fVar3;
    }
    fVar8 = fVar8 - ((float)((int)fVar4 + 0x6000) - fVar4);
  }
  fVar4 = (float)(~-(uint)(fVar9 < 0.0) & (uint)fVar9 |
                 ~-(uint)(-6.1035156e-05 < fVar9) & (uint)fVar9 & -(uint)(fVar9 < 0.0)) / fVar14;
  fVar9 = fVar4;
  if (fVar4 < 0.0 && -6.1035156e-05 < fVar4) {
    fVar9 = 0.0;
  }
  if (fVar4 < 0.0 && -6.1035156e-05 < fVar4 || ABS(fVar4) != INFINITY) {
    fVar4 = 1.1754944e-38;
    if (((uint)fVar9 & 0x7fffff) == 0) {
      fVar4 = (float)((uint)fVar9 & 0x7f800000);
    }
    if (((uint)fVar9 & 0x7f800000) != 0) {
      fVar4 = (float)((uint)fVar9 & 0x7f800000);
    }
    fVar9 = fVar9 + ((float)((int)fVar4 + 0x10000) - fVar4);
  }
  fVar4 = (float)(~-(uint)(fVar6 < 0.0) & (uint)fVar6 |
                 ~-(uint)(-6.1035156e-05 < fVar6) & (uint)fVar6 & -(uint)(fVar6 < 0.0)) / fVar13;
  fVar6 = fVar4;
  if (fVar4 < 0.0 && -6.1035156e-05 < fVar4) {
    fVar6 = 0.0;
  }
  if (fVar4 < 0.0 && -6.1035156e-05 < fVar4 || ABS(fVar4) != INFINITY) {
    fVar4 = 1.1754944e-38;
    if (((uint)fVar6 & 0x7fffff) == 0) {
      fVar4 = (float)((uint)fVar6 & 0x7f800000);
    }
    if (((uint)fVar6 & 0x7f800000) != 0) {
      fVar4 = (float)((uint)fVar6 & 0x7f800000);
    }
    fVar6 = fVar6 + ((float)((int)fVar4 + 0x10000) - fVar4);
  }
  fVar4 = (float)(~-(uint)(fVar1 < 0.0) & (uint)fVar1 |
                 ~-(uint)(-6.1035156e-05 < fVar1) & (uint)fVar1 & -(uint)(fVar1 < 0.0)) / fVar11;
  fVar1 = fVar4;
  if (fVar4 < 0.0 && -6.1035156e-05 < fVar4) {
    fVar1 = 0.0;
  }
  if (fVar4 < 0.0 && -6.1035156e-05 < fVar4 || ABS(fVar4) != INFINITY) {
    fVar4 = 1.1754944e-38;
    if (((uint)fVar1 & 0x7fffff) == 0) {
      fVar4 = (float)((uint)fVar1 & 0x7f800000);
    }
    if (((uint)fVar1 & 0x7f800000) != 0) {
      fVar4 = (float)((uint)fVar1 & 0x7f800000);
    }
    fVar1 = fVar1 + ((float)((int)fVar4 + 0x10000) - fVar4);
  }
  fVar14 = (float)(~-(uint)(0.0 < fVar12) & (uint)fVar12 |
                  ~-(uint)(fVar12 < 6.1035156e-05) & (uint)fVar12 & -(uint)(0.0 < fVar12)) / fVar14;
  fVar12 = fVar14;
  if (0.0 < fVar14 && fVar14 < 6.1035156e-05) {
    fVar12 = 0.0;
  }
  if (0.0 < fVar14 && fVar14 < 6.1035156e-05 || ABS(fVar14) != INFINITY) {
    fVar14 = 1.1754944e-38;
    if (((uint)fVar12 & 0x7fffff) == 0) {
      fVar14 = (float)((uint)fVar12 & 0x7f800000);
    }
    if (((uint)fVar12 & 0x7f800000) != 0) {
      fVar14 = (float)((uint)fVar12 & 0x7f800000);
    }
    fVar12 = fVar12 - ((float)((int)fVar14 + 0x10000) - fVar14);
  }
  fVar13 = (float)(~-(uint)(0.0 < fVar10) & (uint)fVar10 |
                  ~-(uint)(fVar10 < 6.1035156e-05) & (uint)fVar10 & -(uint)(0.0 < fVar10)) / fVar13;
  fVar14 = fVar13;
  if (0.0 < fVar13 && fVar13 < 6.1035156e-05) {
    fVar14 = 0.0;
  }
  if (0.0 < fVar13 && fVar13 < 6.1035156e-05 || ABS(fVar13) != INFINITY) {
    fVar13 = 1.1754944e-38;
    if (((uint)fVar14 & 0x7fffff) == 0) {
      fVar13 = (float)((uint)fVar14 & 0x7f800000);
    }
    if (((uint)fVar14 & 0x7f800000) != 0) {
      fVar13 = (float)((uint)fVar14 & 0x7f800000);
    }
    fVar14 = fVar14 - ((float)((int)fVar13 + 0x10000) - fVar13);
  }
  fVar11 = (float)(~-(uint)(0.0 < fVar8) & (uint)fVar8 |
                  ~-(uint)(fVar8 < 6.1035156e-05) & (uint)fVar8 & -(uint)(0.0 < fVar8)) / fVar11;
  fVar13 = fVar11;
  if (0.0 < fVar11 && fVar11 < 6.1035156e-05) {
    fVar13 = 0.0;
  }
  fVar8 = (float)(~-(uint)(fVar9 < 0.0) & (uint)fVar9 |
                 ~-(uint)(-6.1035156e-05 < fVar9) & (uint)fVar9 & -(uint)(fVar9 < 0.0));
  fVar9 = (float)(~-(uint)(fVar6 < 0.0) & (uint)fVar6 |
                 ~-(uint)(-6.1035156e-05 < fVar6) & (uint)fVar6 & -(uint)(fVar6 < 0.0));
  fVar6 = (float)(~-(uint)(fVar1 < 0.0) & (uint)fVar1 |
                 ~-(uint)(-6.1035156e-05 < fVar1) & (uint)fVar1 & -(uint)(fVar1 < 0.0));
  if (0.0 < fVar11 && fVar11 < 6.1035156e-05 || ABS(fVar11) != INFINITY) {
    fVar11 = 1.1754944e-38;
    if (((uint)fVar13 & 0x7fffff) == 0) {
      fVar11 = (float)((uint)fVar13 & 0x7f800000);
    }
    if (((uint)fVar13 & 0x7f800000) != 0) {
      fVar11 = (float)((uint)fVar13 & 0x7f800000);
    }
    fVar13 = fVar13 - ((float)((int)fVar11 + 0x10000) - fVar11);
  }
  fVar11 = (float)(~-(uint)(0.0 < fVar12) & (uint)fVar12 |
                  ~-(uint)(fVar12 < 6.1035156e-05) & (uint)fVar12 & -(uint)(0.0 < fVar12));
  fVar10 = (float)(~-(uint)(0.0 < fVar14) & (uint)fVar14 |
                  ~-(uint)(fVar14 < 6.1035156e-05) & (uint)fVar14 & -(uint)(0.0 < fVar14));
  fVar13 = (float)(~-(uint)(0.0 < fVar13) & (uint)fVar13 |
                  ~-(uint)(fVar13 < 6.1035156e-05) & (uint)fVar13 & -(uint)(0.0 < fVar13));
  fVar14 = fVar8 + fVar9 + fVar6;
  if (ABS(fVar14) != INFINITY) {
    fVar1 = (float)((uint)fVar14 & 0x7f800000);
    fVar12 = 1.1754944e-38;
    if (((uint)fVar14 & 0x7fffff) == 0) {
      fVar12 = fVar1;
    }
    if (fVar1 != 0.0) {
      fVar12 = fVar1;
    }
    fVar14 = fVar14 + ((float)((int)fVar12 + 0x4000) - fVar12);
  }
  fVar12 = (float)(~-(uint)(fVar14 < 0.0) & (uint)fVar14 |
                  ~-(uint)(-6.1035156e-05 < fVar14) & (uint)fVar14 & -(uint)(fVar14 < 0.0));
  fVar14 = fVar11 + fVar10 + fVar13;
  if (ABS(fVar14) != INFINITY) {
    fVar4 = (float)((uint)fVar14 & 0x7f800000);
    fVar1 = 1.1754944e-38;
    if (((uint)fVar14 & 0x7fffff) == 0) {
      fVar1 = fVar4;
    }
    if (fVar4 != 0.0) {
      fVar1 = fVar4;
    }
    fVar14 = fVar14 - ((float)((int)fVar1 + 0x4000) - fVar1);
  }
  fVar1 = (float)(~-(uint)(0.0 < fVar14) & (uint)fVar14 |
                 ~-(uint)(fVar14 < 6.1035156e-05) & (uint)fVar14 & -(uint)(0.0 < fVar14));
  auVar7 = ZEXT812(0);
  __return_storage_ptr__->max = (Vec3)auVar7;
  (__return_storage_ptr__->min).m_data[0] = 0.0;
  (__return_storage_ptr__->min).m_data[1] = 0.0;
  (__return_storage_ptr__->min).m_data[2] = 0.0;
  fVar14 = 0.0;
  if (fVar11 != 0.0 || fVar8 != 0.0) {
    if ((fVar12 < 0.0) || (0.0 < fVar1)) {
      uVar5 = -(uint)(fVar11 / fVar12 <= fVar11 / fVar1);
      fVar14 = (float)(~uVar5 & (uint)(fVar11 / fVar12) | (uint)(fVar11 / fVar1) & uVar5);
      uVar5 = -(uint)(fVar8 / fVar12 <= fVar8 / fVar1);
      fVar4 = (float)(~uVar5 & (uint)(fVar8 / fVar12) | (uint)(fVar8 / fVar1) & uVar5);
      uVar5 = -(uint)(fVar4 <= fVar14);
      fVar14 = (float)(~uVar5 & (uint)fVar4 | uVar5 & (uint)fVar14);
    }
    else {
      fVar14 = INFINITY;
    }
  }
  fVar4 = fVar14;
  if (fVar14 < 0.0 && -6.1035156e-05 < fVar14) {
    fVar4 = 0.0;
  }
  if (fVar14 < 0.0 && -6.1035156e-05 < fVar14 || ABS(fVar14) != INFINITY) {
    fVar14 = 1.1754944e-38;
    if (((uint)fVar4 & 0x7fffff) == 0) {
      fVar14 = (float)((uint)fVar4 & 0x7f800000);
    }
    if (((uint)fVar4 & 0x7f800000) != 0) {
      fVar14 = (float)((uint)fVar4 & 0x7f800000);
    }
    fVar4 = fVar4 + ((float)((int)fVar14 + 0x10000) - fVar14);
  }
  (__return_storage_ptr__->max).m_data[0] =
       (float)(~-(uint)(fVar4 < 0.0) & (uint)fVar4 |
              ~-(uint)(-6.1035156e-05 < fVar4) & (uint)fVar4 & -(uint)(fVar4 < 0.0));
  fVar14 = 0.0;
  if (fVar10 != 0.0 || fVar9 != 0.0) {
    if ((fVar12 < 0.0) || (0.0 < fVar1)) {
      uVar5 = -(uint)(fVar10 / fVar12 <= fVar10 / fVar1);
      fVar14 = (float)(~uVar5 & (uint)(fVar10 / fVar12) | (uint)(fVar10 / fVar1) & uVar5);
      uVar5 = -(uint)(fVar9 / fVar12 <= fVar9 / fVar1);
      fVar4 = (float)(~uVar5 & (uint)(fVar9 / fVar12) | (uint)(fVar9 / fVar1) & uVar5);
      uVar5 = -(uint)(fVar4 <= fVar14);
      fVar14 = (float)(~uVar5 & (uint)fVar4 | uVar5 & (uint)fVar14);
    }
    else {
      fVar14 = INFINITY;
    }
  }
  fVar4 = fVar14;
  if (fVar14 < 0.0 && -6.1035156e-05 < fVar14) {
    fVar4 = 0.0;
  }
  if (fVar14 < 0.0 && -6.1035156e-05 < fVar14 || ABS(fVar14) != INFINITY) {
    fVar14 = 1.1754944e-38;
    if (((uint)fVar4 & 0x7fffff) == 0) {
      fVar14 = (float)((uint)fVar4 & 0x7f800000);
    }
    if (((uint)fVar4 & 0x7f800000) != 0) {
      fVar14 = (float)((uint)fVar4 & 0x7f800000);
    }
    fVar4 = fVar4 + ((float)((int)fVar14 + 0x10000) - fVar14);
  }
  (__return_storage_ptr__->max).m_data[1] =
       (float)(~-(uint)(fVar4 < 0.0) & (uint)fVar4 |
              ~-(uint)(-6.1035156e-05 < fVar4) & (uint)fVar4 & -(uint)(fVar4 < 0.0));
  fVar14 = 0.0;
  if (fVar13 != 0.0 || fVar6 != 0.0) {
    if ((fVar12 < 0.0) || (0.0 < fVar1)) {
      uVar5 = -(uint)(fVar13 / fVar12 <= fVar13 / fVar1);
      fVar14 = (float)(~uVar5 & (uint)(fVar13 / fVar12) | (uint)(fVar13 / fVar1) & uVar5);
      uVar5 = -(uint)(fVar6 / fVar12 <= fVar6 / fVar1);
      fVar4 = (float)(~uVar5 & (uint)(fVar6 / fVar12) | (uint)(fVar6 / fVar1) & uVar5);
      uVar5 = -(uint)(fVar4 <= fVar14);
      fVar14 = (float)(~uVar5 & (uint)fVar4 | uVar5 & (uint)fVar14);
    }
    else {
      fVar14 = INFINITY;
    }
  }
  fVar4 = fVar14;
  if (fVar14 < 0.0 && -6.1035156e-05 < fVar14) {
    fVar4 = 0.0;
  }
  if (fVar14 < 0.0 && -6.1035156e-05 < fVar14 || ABS(fVar14) != INFINITY) {
    fVar14 = 1.1754944e-38;
    if (((uint)fVar4 & 0x7fffff) == 0) {
      fVar14 = (float)((uint)fVar4 & 0x7f800000);
    }
    if (((uint)fVar4 & 0x7f800000) != 0) {
      fVar14 = (float)((uint)fVar4 & 0x7f800000);
    }
    fVar4 = fVar4 + ((float)((int)fVar14 + 0x10000) - fVar14);
  }
  (__return_storage_ptr__->max).m_data[2] =
       (float)(~-(uint)(fVar4 < 0.0) & (uint)fVar4 |
              ~-(uint)(-6.1035156e-05 < fVar4) & (uint)fVar4 & -(uint)(fVar4 < 0.0));
  fVar14 = 0.0;
  if (fVar11 != 0.0 || fVar8 != 0.0) {
    if ((fVar12 < 0.0) || (0.0 < fVar1)) {
      uVar5 = -(uint)(fVar11 / fVar1 <= fVar11 / fVar12);
      fVar14 = (float)(~uVar5 & (uint)(fVar11 / fVar12) | (uint)(fVar11 / fVar1) & uVar5);
      uVar5 = -(uint)(fVar8 / fVar1 <= fVar8 / fVar12);
      fVar11 = (float)(~uVar5 & (uint)(fVar8 / fVar12) | (uint)(fVar8 / fVar1) & uVar5);
      uVar5 = -(uint)(fVar14 <= fVar11);
      fVar14 = (float)(~uVar5 & (uint)fVar11 | uVar5 & (uint)fVar14);
    }
    else {
      fVar14 = -INFINITY;
    }
  }
  fVar11 = fVar14;
  if (0.0 < fVar14 && fVar14 < 6.1035156e-05) {
    fVar11 = 0.0;
  }
  if (0.0 < fVar14 && fVar14 < 6.1035156e-05 || ABS(fVar14) != INFINITY) {
    fVar14 = 1.1754944e-38;
    if (((uint)fVar11 & 0x7fffff) == 0) {
      fVar14 = (float)((uint)fVar11 & 0x7f800000);
    }
    if (((uint)fVar11 & 0x7f800000) != 0) {
      fVar14 = (float)((uint)fVar11 & 0x7f800000);
    }
    fVar11 = fVar11 - ((float)((int)fVar14 + 0x10000) - fVar14);
  }
  (__return_storage_ptr__->min).m_data[0] =
       (float)(~-(uint)(0.0 < fVar11) & (uint)fVar11 |
              ~-(uint)(fVar11 < 6.1035156e-05) & (uint)fVar11 & -(uint)(0.0 < fVar11));
  fVar14 = 0.0;
  if (fVar10 != 0.0 || fVar9 != 0.0) {
    if ((fVar12 < 0.0) || (0.0 < fVar1)) {
      uVar5 = -(uint)(fVar10 / fVar1 <= fVar10 / fVar12);
      fVar14 = (float)(~uVar5 & (uint)(fVar10 / fVar12) | (uint)(fVar10 / fVar1) & uVar5);
      uVar5 = -(uint)(fVar9 / fVar1 <= fVar9 / fVar12);
      fVar11 = (float)(~uVar5 & (uint)(fVar9 / fVar12) | (uint)(fVar9 / fVar1) & uVar5);
      uVar5 = -(uint)(fVar14 <= fVar11);
      fVar14 = (float)(~uVar5 & (uint)fVar11 | uVar5 & (uint)fVar14);
    }
    else {
      fVar14 = -INFINITY;
    }
  }
  fVar11 = fVar14;
  if (0.0 < fVar14 && fVar14 < 6.1035156e-05) {
    fVar11 = 0.0;
  }
  if (0.0 < fVar14 && fVar14 < 6.1035156e-05 || ABS(fVar14) != INFINITY) {
    fVar14 = 1.1754944e-38;
    if (((uint)fVar11 & 0x7fffff) == 0) {
      fVar14 = (float)((uint)fVar11 & 0x7f800000);
    }
    if (((uint)fVar11 & 0x7f800000) != 0) {
      fVar14 = (float)((uint)fVar11 & 0x7f800000);
    }
    fVar11 = fVar11 - ((float)((int)fVar14 + 0x10000) - fVar14);
  }
  (__return_storage_ptr__->min).m_data[1] =
       (float)(~-(uint)(0.0 < fVar11) & (uint)fVar11 |
              ~-(uint)(fVar11 < 6.1035156e-05) & (uint)fVar11 & -(uint)(0.0 < fVar11));
  fVar14 = 0.0;
  if (fVar13 != 0.0 || fVar6 != 0.0) {
    if ((fVar12 < 0.0) || (0.0 < fVar1)) {
      uVar5 = -(uint)(fVar13 / fVar1 <= fVar13 / fVar12);
      fVar14 = (float)(~uVar5 & (uint)(fVar13 / fVar12) | (uint)(fVar13 / fVar1) & uVar5);
      uVar5 = -(uint)(fVar6 / fVar1 <= fVar6 / fVar12);
      fVar13 = (float)(~uVar5 & (uint)(fVar6 / fVar12) | (uint)(fVar6 / fVar1) & uVar5);
      uVar5 = -(uint)(fVar14 <= fVar13);
      fVar14 = (float)(~uVar5 & (uint)fVar13 | uVar5 & (uint)fVar14);
    }
    else {
      fVar14 = -INFINITY;
    }
  }
  fVar13 = fVar14;
  if (0.0 < fVar14 && fVar14 < 6.1035156e-05) {
    fVar13 = 0.0;
  }
  if (0.0 < fVar14 && fVar14 < 6.1035156e-05 || ABS(fVar14) != INFINITY) {
    fVar14 = 1.1754944e-38;
    if (((uint)fVar13 & 0x7fffff) == 0) {
      fVar14 = (float)((uint)fVar13 & 0x7f800000);
    }
    if (((uint)fVar13 & 0x7f800000) != 0) {
      fVar14 = (float)((uint)fVar13 & 0x7f800000);
    }
    fVar13 = fVar13 - ((float)((int)fVar14 + 0x10000) - fVar14);
  }
  (__return_storage_ptr__->min).m_data[2] =
       (float)(~-(uint)(0.0 < fVar13) & (uint)fVar13 |
              ~-(uint)(fVar13 < 6.1035156e-05) & (uint)fVar13 & -(uint)(0.0 < fVar13));
  return returnValue;
}

Assistant:

InterpolationRange calcTriangleInterpolationWeights (const tcu::Vec4& p0, const tcu::Vec4& p1, const tcu::Vec4& p2, const tcu::Vec2& ndpixel)
{
	const int roundError		= 1;
	const int barycentricError	= 3;
	const int divError			= 8;

	const tcu::Vec2 nd0 = p0.swizzle(0, 1) / p0.w();
	const tcu::Vec2 nd1 = p1.swizzle(0, 1) / p1.w();
	const tcu::Vec2 nd2 = p2.swizzle(0, 1) / p2.w();

	const float ka = triangleArea(ndpixel, nd1, nd2);
	const float kb = triangleArea(ndpixel, nd2, nd0);
	const float kc = triangleArea(ndpixel, nd0, nd1);

	const float kaMax = getMaxFlushToZero(getMaxValueWithinError(ka, barycentricError));
	const float kbMax = getMaxFlushToZero(getMaxValueWithinError(kb, barycentricError));
	const float kcMax = getMaxFlushToZero(getMaxValueWithinError(kc, barycentricError));
	const float kaMin = getMinFlushToZero(getMinValueWithinError(ka, barycentricError));
	const float kbMin = getMinFlushToZero(getMinValueWithinError(kb, barycentricError));
	const float kcMin = getMinFlushToZero(getMinValueWithinError(kc, barycentricError));
	DE_ASSERT(kaMin <= kaMax);
	DE_ASSERT(kbMin <= kbMax);
	DE_ASSERT(kcMin <= kcMax);

	// calculate weights: vec3(ka / p0.w, kb / p1.w, kc / p2.w) / (ka / p0.w + kb / p1.w + kc / p2.w)
	const float maxPreDivisionValues[3] =
	{
		getMaxFlushToZero(getMaxValueWithinError(getMaxFlushToZero(kaMax / p0.w()), divError)),
		getMaxFlushToZero(getMaxValueWithinError(getMaxFlushToZero(kbMax / p1.w()), divError)),
		getMaxFlushToZero(getMaxValueWithinError(getMaxFlushToZero(kcMax / p2.w()), divError)),
	};
	const float minPreDivisionValues[3] =
	{
		getMinFlushToZero(getMinValueWithinError(getMinFlushToZero(kaMin / p0.w()), divError)),
		getMinFlushToZero(getMinValueWithinError(getMinFlushToZero(kbMin / p1.w()), divError)),
		getMinFlushToZero(getMinValueWithinError(getMinFlushToZero(kcMin / p2.w()), divError)),
	};
	DE_ASSERT(minPreDivisionValues[0] <= maxPreDivisionValues[0]);
	DE_ASSERT(minPreDivisionValues[1] <= maxPreDivisionValues[1]);
	DE_ASSERT(minPreDivisionValues[2] <= maxPreDivisionValues[2]);

	const float maxDivisor = getMaxFlushToZero(getMaxValueWithinError(maxPreDivisionValues[0] + maxPreDivisionValues[1] + maxPreDivisionValues[2], 2*roundError));
	const float minDivisor = getMinFlushToZero(getMinValueWithinError(minPreDivisionValues[0] + minPreDivisionValues[1] + minPreDivisionValues[2], 2*roundError));
	DE_ASSERT(minDivisor <= maxDivisor);

	InterpolationRange returnValue;

	returnValue.max.x() = getMaxFlushToZero(getMaxValueWithinError(getMaxFlushToZero(maximalRangeDivision(minPreDivisionValues[0], maxPreDivisionValues[0], minDivisor, maxDivisor)), divError));
	returnValue.max.y() = getMaxFlushToZero(getMaxValueWithinError(getMaxFlushToZero(maximalRangeDivision(minPreDivisionValues[1], maxPreDivisionValues[1], minDivisor, maxDivisor)), divError));
	returnValue.max.z() = getMaxFlushToZero(getMaxValueWithinError(getMaxFlushToZero(maximalRangeDivision(minPreDivisionValues[2], maxPreDivisionValues[2], minDivisor, maxDivisor)), divError));
	returnValue.min.x() = getMinFlushToZero(getMinValueWithinError(getMinFlushToZero(minimalRangeDivision(minPreDivisionValues[0], maxPreDivisionValues[0], minDivisor, maxDivisor)), divError));
	returnValue.min.y() = getMinFlushToZero(getMinValueWithinError(getMinFlushToZero(minimalRangeDivision(minPreDivisionValues[1], maxPreDivisionValues[1], minDivisor, maxDivisor)), divError));
	returnValue.min.z() = getMinFlushToZero(getMinValueWithinError(getMinFlushToZero(minimalRangeDivision(minPreDivisionValues[2], maxPreDivisionValues[2], minDivisor, maxDivisor)), divError));

	DE_ASSERT(returnValue.min.x() <= returnValue.max.x());
	DE_ASSERT(returnValue.min.y() <= returnValue.max.y());
	DE_ASSERT(returnValue.min.z() <= returnValue.max.z());

	return returnValue;
}